

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackframe.cpp
# Opt level: O2

void __thiscall
stackjit::StackWalker::visitReferences
          (StackWalker *this,StackFrame *stackFrame,VisitReferenceFn *fn,VisitFrameFn *frameFn)

{
  int iVar1;
  ManagedFunction *pMVar2;
  ExecutionEngine *pEVar3;
  CallStack *pCVar4;
  CallStackEntry *pCVar5;
  CallStackEntry *pCVar6;
  function<void_(stackjit::StackFrameEntry)> *pfVar7;
  StackFrame callStackFrame;
  int local_a4;
  StackFrame local_88;
  function<void_(stackjit::StackFrameEntry)> local_70;
  function<void_(stackjit::StackFrameEntry)> local_50;
  
  if ((frameFn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_stackjit::StackFrame_&)>::operator()(frameFn,stackFrame);
  }
  pfVar7 = &local_70;
  std::function<void_(stackjit::StackFrameEntry)>::function(&local_70,fn);
  visitReferencesInFrame((StackWalker *)pfVar7,stackFrame,&local_70);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  pEVar3 = VMState::engine(this->mVMState);
  pCVar4 = ExecutionEngine::callStack(pEVar3);
  pCVar5 = CallStack::top(pCVar4);
  local_a4 = 0;
  while( true ) {
    pEVar3 = VMState::engine(this->mVMState);
    pCVar4 = ExecutionEngine::callStack(pEVar3);
    pCVar6 = CallStack::start(pCVar4);
    if (pCVar5 <= pCVar6) break;
    pMVar2 = pCVar5->function;
    iVar1 = pCVar5->callPoint;
    local_88.mBasePtr = findBasePtr((StackWalker *)pCVar4,stackFrame->mBasePtr,0,local_a4);
    local_88.mFunction = pMVar2;
    local_88.mInstructionIndex = iVar1;
    if ((frameFn->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(const_stackjit::StackFrame_&)>::operator()(frameFn,&local_88);
    }
    pfVar7 = &local_50;
    std::function<void_(stackjit::StackFrameEntry)>::function(&local_50,fn);
    visitReferencesInFrame((StackWalker *)pfVar7,&local_88,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    pCVar5 = pCVar5 + -1;
    local_a4 = local_a4 + 1;
  }
  return;
}

Assistant:

void StackWalker::visitReferences(const StackFrame& stackFrame,	VisitReferenceFn fn, VisitFrameFn frameFn) {
		if (frameFn) {
			frameFn(stackFrame);
		}

		//Visit the calling stack frame
		visitReferencesInFrame(stackFrame, fn);

		//Then all other stack frames
		auto topEntryPtr = mVMState.engine().callStack().top();
		int topFuncIndex = 0;
		while (topEntryPtr > mVMState.engine().callStack().start()) {
			auto callEntry = *topEntryPtr;
			auto topFunc = callEntry.function;
			auto callPoint = callEntry.callPoint;
			auto callBasePtr = findBasePtr(stackFrame.basePtr(), 0, topFuncIndex);

			StackFrame callStackFrame(callBasePtr, topFunc, callPoint);
			if (frameFn) {
				frameFn(callStackFrame);
			}

			visitReferencesInFrame(callStackFrame, fn);

			topEntryPtr--;
			topFuncIndex++;
		}
	}